

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void dwt1(wt_object wt,double *sig,int len_sig,double *cA,double *cD)

{
  int iVar1;
  int iVar2;
  int iVar3;
  conv_object pcVar4;
  double *local_50;
  double *cA_undec;
  double *signal;
  int lf;
  int D;
  int len_avg;
  double *cD_local;
  double *cA_local;
  int len_sig_local;
  double *sig_local;
  wt_object wt_local;
  
  iVar1 = (wt->wave->lpd_len + wt->wave->hpd_len) / 2;
  iVar2 = strcmp(wt->ext,"per");
  if (iVar2 == 0) {
    cA_undec = (double *)malloc((long)(len_sig + iVar1 + len_sig % 2) << 3);
    iVar2 = per_ext(sig,len_sig,iVar1 / 2,cA_undec);
    local_50 = (double *)malloc((long)(iVar2 + iVar1 + wt->wave->lpd_len + -1) << 3);
    if ((wt->wave->lpd_len == wt->wave->hpd_len) &&
       ((iVar3 = strcmp(wt->cmethod,"fft"), iVar3 == 0 ||
        (iVar3 = strcmp(wt->cmethod,"FFT"), iVar3 == 0)))) {
      pcVar4 = conv_init(iVar2 + iVar1,wt->wave->lpd_len);
      wt->cobj = pcVar4;
      wt->cfftset = 1;
    }
    else if (wt->wave->lpd_len != wt->wave->hpd_len) {
      printf("Decomposition Filters must have the same length.");
      exit(-1);
    }
    wconv(wt,cA_undec,iVar2 + iVar1,wt->wave->lpd,wt->wave->lpd_len,local_50);
    downsamp(local_50 + iVar1,iVar2,2,cA);
    wconv(wt,cA_undec,iVar2 + iVar1,wt->wave->hpd,wt->wave->hpd_len,local_50);
    downsamp(local_50 + iVar1,iVar2,2,cD);
  }
  else {
    iVar1 = strcmp(wt->ext,"sym");
    if (iVar1 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    iVar1 = wt->wave->lpd_len;
    cA_undec = (double *)malloc((long)(len_sig + (iVar1 + -1) * 2) << 3);
    iVar2 = symm_ext(sig,len_sig,iVar1 + -1,cA_undec);
    local_50 = (double *)malloc((long)(iVar2 + (iVar1 + -1) * 3) << 3);
    if ((wt->wave->lpd_len == wt->wave->hpd_len) &&
       ((iVar3 = strcmp(wt->cmethod,"fft"), iVar3 == 0 ||
        (iVar3 = strcmp(wt->cmethod,"FFT"), iVar3 == 0)))) {
      pcVar4 = conv_init(iVar2 + (iVar1 + -1) * 2,iVar1);
      wt->cobj = pcVar4;
      wt->cfftset = 1;
    }
    else if (wt->wave->lpd_len != wt->wave->hpd_len) {
      printf("Decomposition Filters must have the same length.");
      exit(-1);
    }
    wconv(wt,cA_undec,iVar2 + (iVar1 + -1) * 2,wt->wave->lpd,wt->wave->lpd_len,local_50);
    downsamp(local_50 + iVar1,iVar2 + iVar1 + -2,2,cA);
    wconv(wt,cA_undec,iVar2 + (iVar1 + -1) * 2,wt->wave->hpd,wt->wave->hpd_len,local_50);
    downsamp(local_50 + iVar1,iVar2 + iVar1 + -2,2,cD);
  }
  if ((wt->wave->lpd_len == wt->wave->hpd_len) &&
     ((iVar1 = strcmp(wt->cmethod,"fft"), iVar1 == 0 ||
      (iVar1 = strcmp(wt->cmethod,"FFT"), iVar1 == 0)))) {
    free_conv(wt->cobj);
    wt->cfftset = 0;
  }
  free(cA_undec);
  free(local_50);
  return;
}

Assistant:

static void dwt1(wt_object wt,double *sig,int len_sig, double *cA, double *cD) {
	int len_avg,D,lf;
	double *signal,*cA_undec;
	len_avg = (wt->wave->lpd_len + wt->wave->hpd_len) / 2;
	//len_sig = 2 * (int)ceil((double)len_sig / 2.0);

	D = 2;

	if (!strcmp(wt->ext, "per")) {
		signal = (double*)malloc(sizeof(double)* (len_sig + len_avg + (len_sig % 2)));

		len_sig = per_ext(sig, len_sig, len_avg / 2, signal);

		cA_undec = (double*)malloc(sizeof(double)* (len_sig + len_avg + wt->wave->lpd_len - 1));

		if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
			wt->cobj = conv_init(len_sig + len_avg, wt->wave->lpd_len);
			wt->cfftset = 1;
		}
		else if (!(wt->wave->lpd_len == wt->wave->hpd_len)) {
			printf("Decomposition Filters must have the same length.");
			exit(-1);
		}

		wconv(wt, signal, len_sig + len_avg, wt->wave->lpd, wt->wave->lpd_len, cA_undec);

		downsamp(cA_undec + len_avg, len_sig, D, cA);

		wconv(wt, signal, len_sig + len_avg, wt->wave->hpd, wt->wave->hpd_len, cA_undec);

		downsamp(cA_undec + len_avg, len_sig, D, cD);
	}
	else if (!strcmp(wt->ext, "sym")) {
		//printf("\n YES %s \n", wt->ext);
		lf = wt->wave->lpd_len;// lpd and hpd have the same length

		signal = (double*)malloc(sizeof(double)* (len_sig + 2 * (lf - 1)));

		len_sig = symm_ext(sig, len_sig, lf - 1, signal);

		cA_undec = (double*)malloc(sizeof(double)* (len_sig + 3 * (lf - 1)));

		if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
			wt->cobj = conv_init(len_sig + 2 * (lf - 1), lf);
			wt->cfftset = 1;
		}
		else if (!(wt->wave->lpd_len == wt->wave->hpd_len)) {
			printf("Decomposition Filters must have the same length.");
			exit(-1);
		}


		wconv(wt, signal, len_sig + 2 * (lf - 1), wt->wave->lpd, wt->wave->lpd_len, cA_undec);

		downsamp(cA_undec + lf, len_sig + lf - 2, D, cA);

		wconv(wt, signal, len_sig + 2 * (lf - 1), wt->wave->hpd, wt->wave->hpd_len, cA_undec);

		downsamp(cA_undec + lf, len_sig + lf - 2, D, cD);
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}


	if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
		free_conv(wt->cobj);
		wt->cfftset = 0;
	}

	free(signal);
	free(cA_undec);
}